

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O2

bool __thiscall Disa::Adjacency_Graph<false>::insert(Adjacency_Graph<false> *this,Edge *edge)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  ulong *puVar4;
  ulong uVar5;
  ostream *poVar6;
  source_location *in_RCX;
  long lVar7;
  ulong *puVar8;
  ulong insert_vertex;
  ulong vertex;
  pair<const_unsigned_long_&,_const_unsigned_long_&> pVar9;
  string sStack_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (edge->first != edge->second) {
    bVar3 = contains(this,edge);
    if (!bVar3) {
      pVar9 = order_edge_vertex(edge);
      puVar8 = pVar9.second;
      puVar4 = pVar9.first;
      vertex = *puVar4;
      insert_vertex = *puVar8;
      uVar5 = insert_vertex;
      if (insert_vertex < vertex) {
        uVar5 = vertex;
      }
      lVar7 = (long)(this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar7 == 0) || ((lVar7 >> 3) - 1U <= uVar5)) {
        local_40._M_dataplus._M_p = (pointer)(uVar5 + 1);
        resize(this,(size_t *)&local_40);
        vertex = *puVar4;
        insert_vertex = *puVar8;
      }
      insert_vertex_adjacent_list(this,vertex,insert_vertex);
      puVar1 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::
      for_each<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Disa::Adjacency_Graph<false>::insert(std::pair<unsigned_long,unsigned_long>const&)::_lambda(unsigned_long&)_1_>
                (puVar1 + *puVar4 + 1,puVar1 + *puVar8 + 2);
      insert_vertex_adjacent_list(this,*puVar8,*puVar4);
      puVar2 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar1 = puVar2 + *puVar8 + 1;
      *puVar1 = *puVar1 + 1;
      std::
      for_each<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Disa::Adjacency_Graph<false>::insert(std::pair<unsigned_long,unsigned_long>const&)::_lambda(unsigned_long&)_2_>
                (puVar2 + *puVar8 + 2,
                 (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    return !bVar3;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_00150a18;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,in_RCX);
  poVar6 = std::operator<<(poVar6,(string *)&local_40);
  std::__cxx11::to_string(&local_e8,edge->first);
  std::operator+(&local_c8,"Edge vertices identical, ",&local_e8);
  std::operator+(&local_a8,&local_c8," and ");
  std::__cxx11::to_string(&sStack_108,edge->second);
  std::operator+(&local_88,&local_a8,&sStack_108);
  std::operator+(&local_68,&local_88,".");
  poVar6 = std::operator<<(poVar6,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

bool Adjacency_Graph<_directed>::insert(const Edge& edge) {
  ASSERT_DEBUG(edge.first != edge.second,
               "Edge vertices identical, " + std::to_string(edge.first) + " and " + std::to_string(edge.second) + ".");

  // Preliminaries check if the edge exists, then determine if we need to resize.
  if(contains(edge)) return false;
  const auto& [i_first_vertex, i_second_vertex] =
  !_directed ? order_edge_vertex(&edge) : std::pair<const std::size_t&, const std::size_t&>({edge.first, edge.second});
  if(std::max(i_first_vertex, i_second_vertex) >= size_vertex()) resize(std::max(i_first_vertex, i_second_vertex) + 1);

  // Insert lower vertex.
  insert_vertex_adjacent_list(i_first_vertex, i_second_vertex);
  std::for_each(std::next(offset.begin(), static_cast<s_size_t>(i_first_vertex + 1)),
                !_directed ? std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 2)) : offset.end(),
                [](std::size_t& off) { off++; });
  if(_directed) return true;

  // Insert upper vertex (tricky: last for loop is safe -> The highest vertex + 1 (for size) + 1 (for offset) <= end()).
  insert_vertex_adjacent_list(i_second_vertex, i_first_vertex);
  ++(*std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 1)));
  std::for_each(std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 2)), offset.end(),
                [](std::size_t& off) { off += 2; });

  return true;
}